

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> * __thiscall
wallet::CWallet::GetActiveHDPubKeys(CWallet *this)

{
  bool bVar1;
  reference ppSVar2;
  char *pszFile;
  AnnotatedMixin<std::recursive_mutex> *pAVar3;
  element_type *peVar4;
  set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *in_RDI;
  long in_FS_OFFSET;
  DescriptorScriptPubKeyMan *desc_spkm;
  ScriptPubKeyMan **spkm;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range1;
  set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *active_xpubs;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock76;
  set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> desc_xpubs;
  set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> desc_pubkeys;
  WalletDescriptor w_desc;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  DescriptorScriptPubKeyMan *in_stack_fffffffffffffdc0;
  CWallet *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  int line;
  ScriptPubKeyMan *pszName;
  char *this_00;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 uVar5;
  undefined1 local_188 [48];
  _Base_ptr local_8;
  
  line = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_8 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  this_00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
  ;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdbc,(AnnotatedMixin<std::recursive_mutex> *)0x1c60aa);
  IsWalletFlagSet(in_stack_fffffffffffffdc8,(uint64_t)in_stack_fffffffffffffdc0);
  inline_assertion_check<true,bool>
            ((bool *)this_00,(char *)in_RDI,line,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8
            );
  uVar5 = 0;
  std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::set
            ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  GetActiveScriptPubKeyMans((CWallet *)CONCAT17(uVar5,in_stack_fffffffffffffe38));
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
           *)in_stack_fffffffffffffdc0);
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
         *)in_stack_fffffffffffffdc0);
  while( true ) {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffdc8,(_Self *)in_stack_fffffffffffffdc0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    ppSVar2 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                        ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                         CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    pszName = *ppSVar2;
    if (pszName == (ScriptPubKeyMan *)0x0) {
      pszFile = (char *)0x0;
    }
    else {
      pszFile = (char *)__dynamic_cast(pszName,&ScriptPubKeyMan::typeinfo,
                                       &DescriptorScriptPubKeyMan::typeinfo,0);
    }
    if (pszFile == (char *)0x0) break;
    pAVar3 = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                       ((AnnotatedMixin<std::recursive_mutex> *)
                        CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00,
               (AnnotatedMixin<std::recursive_mutex> *)in_RDI,(char *)pszName,pszFile,
               (int)((ulong)pAVar3 >> 0x20),SUB81((ulong)pAVar3 >> 0x18,0));
    DescriptorScriptPubKeyMan::GetWalletDescriptor(in_stack_fffffffffffffdc0);
    in_stack_fffffffffffffdc8 = (CWallet *)&stack0xfffffffffffffea8;
    std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::set
              ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::set
              ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    peVar4 = std::__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    (*peVar4->_vptr_Descriptor[0xf])(peVar4,in_stack_fffffffffffffdc8,local_188);
    std::set<CExtPubKey,std::less<CExtPubKey>,std::allocator<CExtPubKey>>::
    merge<std::less<CExtPubKey>>
              ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)0x1c62bb);
    std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::~set
              ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::~set
              ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    WalletDescriptor::~WalletDescriptor
              ((WalletDescriptor *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
              ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  }
  __assert_fail("desc_spkm",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                ,0x11fd,"std::set<CExtPubKey> wallet::CWallet::GetActiveHDPubKeys() const");
}

Assistant:

std::set<CExtPubKey> CWallet::GetActiveHDPubKeys() const
{
    AssertLockHeld(cs_wallet);

    Assert(IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));

    std::set<CExtPubKey> active_xpubs;
    for (const auto& spkm : GetActiveScriptPubKeyMans()) {
        const DescriptorScriptPubKeyMan* desc_spkm = dynamic_cast<DescriptorScriptPubKeyMan*>(spkm);
        assert(desc_spkm);
        LOCK(desc_spkm->cs_desc_man);
        WalletDescriptor w_desc = desc_spkm->GetWalletDescriptor();

        std::set<CPubKey> desc_pubkeys;
        std::set<CExtPubKey> desc_xpubs;
        w_desc.descriptor->GetPubKeys(desc_pubkeys, desc_xpubs);
        active_xpubs.merge(std::move(desc_xpubs));
    }
    return active_xpubs;
}